

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_maximum_likelihood_parameter_generation.cc
# Opt level: O2

bool __thiscall
sptk::RecursiveMaximumLikelihoodParameterGeneration::Get
          (RecursiveMaximumLikelihoodParameterGeneration *this,
          vector<double,_std::allocator<double>_> *smoothed_static_parameters)

{
  uint uVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  pointer pvVar8;
  pointer pdVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  
  bVar5 = false;
  if ((smoothed_static_parameters != (vector<double,_std::allocator<double>_> *)0x0) &&
     (bVar5 = false, this->is_valid_ != false)) {
    iVar6 = (*this->input_source_->_vptr_InputSourceInterface[4])
                      (this->input_source_,&this->buffer_);
    if ((char)iVar6 == '\0') {
      pdVar3 = (this->buffer_).static_and_dynamic_parameters.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar4 = (this->buffer_).static_and_dynamic_parameters.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      lVar10 = (long)(int)((ulong)((long)pdVar4 - (long)pdVar3) >> 4);
      pdVar9 = pdVar3 + lVar10;
      for (lVar12 = 0; lVar10 * 8 != lVar12; lVar12 = lVar12 + 8) {
        *(undefined8 *)((long)pdVar3 + lVar12) = 0;
      }
      for (; pdVar9 != pdVar4; pdVar9 = pdVar9 + 1) {
        *pdVar9 = 1.79769313486232e+308;
      }
      if (this->num_remaining_frame_ < 2) {
        return false;
      }
      this->num_remaining_frame_ = this->num_remaining_frame_ + -1;
    }
    Forward(this);
    uVar7 = (*(this->super_InputSourceInterface)._vptr_InputSourceInterface[2])(this);
    pdVar9 = (smoothed_static_parameters->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((long)(smoothed_static_parameters->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_finish - (long)pdVar9 >> 3 != (long)(int)uVar7) {
      std::vector<double,_std::allocator<double>_>::resize
                (smoothed_static_parameters,(long)(int)uVar7);
      pdVar9 = (smoothed_static_parameters->super__Vector_base<double,_std::allocator<double>_>).
               _M_impl.super__Vector_impl_data._M_start;
    }
    uVar1 = this->num_past_frame_;
    iVar6 = this->current_frame_;
    iVar2 = this->calculation_field_;
    pvVar8 = (this->buffer_).c.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = 0;
    uVar13 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar13 = uVar11;
    }
    for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
      pdVar9[uVar11] =
           *(double *)
            (*(long *)&(pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + (long)((int)(~uVar1 + iVar6) % iVar2) * 8);
      pvVar8 = pvVar8 + 1;
    }
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool RecursiveMaximumLikelihoodParameterGeneration::Get(
    std::vector<double>* smoothed_static_parameters) {
  if (!is_valid_ || NULL == smoothed_static_parameters) {
    return false;
  }

  if (!input_source_->Get(&buffer_.static_and_dynamic_parameters)) {
    const int static_and_dynamic_size(
        static_cast<int>(buffer_.static_and_dynamic_parameters.size() / 2));
    // Unobserbed mean is zero.
    std::fill(
        buffer_.static_and_dynamic_parameters.begin(),
        buffer_.static_and_dynamic_parameters.begin() + static_and_dynamic_size,
        0.0);
    // Unobserved variance is infinite.
    std::fill(
        buffer_.static_and_dynamic_parameters.begin() + static_and_dynamic_size,
        buffer_.static_and_dynamic_parameters.end(), kInf);
    if (num_remaining_frame_ <= 1) {
      return false;
    }
    --num_remaining_frame_;
  }
  Forward();

  const int static_size(GetSize());
  if (smoothed_static_parameters->size() !=
      static_cast<std::size_t>(static_size)) {
    smoothed_static_parameters->resize(static_size);
  }

  const int t((current_frame_ - num_past_frame_ - 1) % calculation_field_);
  double* output(&((*smoothed_static_parameters)[0]));
  for (int m(0); m < static_size; ++m) {
    output[m] = buffer_.c[m][t];
  }

  return true;
}